

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::UnsafeShallowSwapFields
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (message1->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  uVar2 = (message2->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar1 == uVar2) {
    SwapFieldsImpl<true>(this,message1,message2,fields);
    return;
  }
  UnsafeShallowSwapFields();
}

Assistant:

void Reflection::UnsafeShallowSwapFields(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  ABSL_DCHECK_EQ(message1->GetArena(), message2->GetArena());

  SwapFieldsImpl<true>(message1, message2, fields);
}